

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

int secp256k1_scalar_is_high(secp256k1_scalar *a)

{
  uint uVar1;
  uint uVar2;
  secp256k1_scalar *in_RDI;
  int no;
  int yes;
  
  secp256k1_scalar_verify(in_RDI);
  uVar2 = (uint)(in_RDI->d[3] < 0x7fffffffffffffff);
  uVar1 = (uint)(0x7fffffffffffffff < in_RDI->d[3]) & (uVar2 ^ 0xffffffff);
  uVar2 = (uint)(in_RDI->d[1] < 0x5d576e7357a4501d) & (uVar1 ^ 0xffffffff) |
          (uint)(in_RDI->d[2] != 0xffffffffffffffff) & (uVar1 ^ 0xffffffff) | uVar2;
  return (uint)(0xdfe92f46681b20a0 < in_RDI->d[0]) & (uVar2 ^ 0xffffffff) |
         (uint)(0x5d576e7357a4501d < in_RDI->d[1]) & (uVar2 ^ 0xffffffff) | uVar1;
}

Assistant:

static int secp256k1_scalar_is_high(const secp256k1_scalar *a) {
    int yes = 0;
    int no = 0;
    SECP256K1_SCALAR_VERIFY(a);

    no |= (a->d[3] < SECP256K1_N_H_3);
    yes |= (a->d[3] > SECP256K1_N_H_3) & ~no;
    no |= (a->d[2] < SECP256K1_N_H_2) & ~yes; /* No need for a > check. */
    no |= (a->d[1] < SECP256K1_N_H_1) & ~yes;
    yes |= (a->d[1] > SECP256K1_N_H_1) & ~no;
    yes |= (a->d[0] > SECP256K1_N_H_0) & ~no;
    return yes;
}